

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudotopoorder.cpp
# Opt level: O1

void __thiscall PseudoTopoOrder::RecalcTopoInverse(PseudoTopoOrder *this)

{
  pointer piVar1;
  pointer piVar2;
  long lVar3;
  long lVar4;
  
  piVar1 = (this->pto).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  lVar3 = (long)(this->pto).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 2;
    piVar2 = (this->pto_inverse).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      piVar2[piVar1[lVar4]] = (int)lVar4;
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  if (0 < this->first_unknown) {
    this->first_unknown = 0;
  }
  this->path_filled = false;
  return;
}

Assistant:

void PseudoTopoOrder::RecalcTopoInverse()
{
	for (int i = 0; i < pto.size(); ++i)
	{
		pto_inverse[pto[i]] = i;
	}

	AnnounceModification(0);
}